

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

phf_hash_t
PHF::hash<std::__cxx11::string>
          (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  code *UNRECOVERED_JUMPTABLE;
  phf_hash_t pVar1;
  
  if ((code *)phf->g_jmp != (code *)0x0) {
    pVar1 = (*(code *)phf->g_jmp)();
    return pVar1;
  }
  UNRECOVERED_JUMPTABLE =
       (code *)hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::jmp[phf->g_op];
  phf->g_jmp = UNRECOVERED_JUMPTABLE;
  pVar1 = (*UNRECOVERED_JUMPTABLE)();
  return pVar1;
}

Assistant:

PHF_PUBLIC phf_hash_t PHF::hash(struct phf *phf, T k) {
#if PHF_HAVE_COMPUTED_GOTOS && !PHF_NO_COMPUTED_GOTOS
	static const void *const jmp[] = {
		NULL,
		&&uint8_mod_r, &&uint8_band_r,
		&&uint16_mod_r, &&uint16_band_r,
		&&uint32_mod_r, &&uint32_band_r,
	};

	goto *((phf->g_jmp)? phf->g_jmp : (phf->g_jmp = jmp[phf->g_op]));

	uint8_mod_r:
		return phf_hash_<false>(reinterpret_cast<uint8_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	uint8_band_r:
		return phf_hash_<true>(reinterpret_cast<uint8_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	uint16_mod_r:
		return phf_hash_<false>(reinterpret_cast<uint16_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	uint16_band_r:
		return phf_hash_<true>(reinterpret_cast<uint16_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	uint32_mod_r:
		return phf_hash_<false>(reinterpret_cast<uint32_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	uint32_band_r:
		return phf_hash_<true>(reinterpret_cast<uint32_t *>(phf->g), k, phf->seed, phf->r, phf->m);
#else
	switch (phf->g_op) {
	case phf::PHF_G_UINT8_MOD_R:
		return phf_hash_<false>(reinterpret_cast<uint8_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	case phf::PHF_G_UINT8_BAND_R:
		return phf_hash_<true>(reinterpret_cast<uint8_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	case phf::PHF_G_UINT16_MOD_R:
		return phf_hash_<false>(reinterpret_cast<uint16_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	case phf::PHF_G_UINT16_BAND_R:
		return phf_hash_<true>(reinterpret_cast<uint16_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	case phf::PHF_G_UINT32_MOD_R:
		return phf_hash_<false>(reinterpret_cast<uint32_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	case phf::PHF_G_UINT32_BAND_R:
		return phf_hash_<true>(reinterpret_cast<uint32_t *>(phf->g), k, phf->seed, phf->r, phf->m);
	default:
		abort();
		return 0;
	}
#endif
}